

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

uint32_t __thiscall tinyusdz::primvar::PrimVar::type_id(PrimVar *this)

{
  bool bVar1;
  PrimVar *this_local;
  
  bVar1 = is_valid(this);
  if (bVar1) {
    bVar1 = has_default(this);
    if (bVar1) {
      this_local._4_4_ = tinyusdz::value::Value::type_id(&this->_value);
    }
    else {
      bVar1 = has_timesamples(this);
      if (bVar1) {
        this_local._4_4_ = tinyusdz::value::TimeSamples::type_id(&this->_ts);
      }
      else {
        this_local._4_4_ = 0;
      }
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t type_id() const {
    if (!is_valid()) {
      return value::TYPE_ID_INVALID;
    }

    if (has_default()) {
      return _value.type_id();
    }

    if (has_timesamples()) {
      return _ts.type_id();
    }

    return value::TypeId::TYPE_ID_INVALID;

  }